

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mojoshader_opengl.c
# Opt level: O1

void impl_ARB1_PushUniforms(void)

{
  MOJOSHADER_shaderType MVar1;
  MOJOSHADER_uniformType MVar2;
  MOJOSHADER_glProgram *pMVar3;
  MOJOSHADER_uniform *pMVar4;
  uint uVar5;
  int *piVar6;
  GLenum GVar7;
  ulong uVar8;
  ulong uVar9;
  MOJOSHADER_shaderType MVar10;
  int *piVar11;
  ulong uVar12;
  int iVar13;
  GLfloat *pGVar14;
  GLuint GVar15;
  GLfloat fv [4];
  float local_58;
  float local_54;
  float local_50;
  float local_4c;
  ulong local_40;
  ulong local_38;
  
  pMVar3 = ctx->bound_program;
  local_38 = (ulong)pMVar3->uniform_count;
  if (local_38 == 0) {
    __assert_fail("count > 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/andburn[P]mojoshader/mojoshader_opengl.c"
                  ,0x327,"void impl_ARB1_PushUniforms(void)");
  }
  piVar6 = pMVar3->vs_uniforms_bool;
  pGVar14 = pMVar3->vs_uniforms_float4;
  piVar11 = pMVar3->vs_uniforms_int4;
  uVar8 = 0;
  GVar7 = 0x8620;
  MVar10 = MOJOSHADER_TYPE_VERTEX;
  uVar12 = 0;
  local_40 = 0;
  do {
    pMVar4 = pMVar3->uniforms[uVar8].uniform;
    iVar13 = pMVar4->array_count + (uint)(pMVar4->array_count == 0);
    if (pMVar4->constant != 0) {
      __assert_fail("!u->constant",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/andburn[P]mojoshader/mojoshader_opengl.c"
                    ,0x331,"void impl_ARB1_PushUniforms(void)");
    }
    MVar1 = pMVar3->uniforms[uVar8].shader_type;
    MVar2 = pMVar4->type;
    if (MVar10 != MVar1) {
      uVar9 = local_40 & 0xffffffff;
      if (MVar10 == MOJOSHADER_TYPE_PIXEL) {
        uVar9 = uVar12;
      }
      if (MVar1 != MOJOSHADER_TYPE_PIXEL) {
        __assert_fail("0 && \"Unexpected shader type\"",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/andburn[P]mojoshader/mojoshader_opengl.c"
                      ,0x346,"void impl_ARB1_PushUniforms(void)");
      }
      local_40 = uVar9;
      if (MVar10 != MOJOSHADER_TYPE_VERTEX) {
        __assert_fail("shader_type == MOJOSHADER_TYPE_VERTEX",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/andburn[P]mojoshader/mojoshader_opengl.c"
                      ,0x33d,"void impl_ARB1_PushUniforms(void)");
      }
      pGVar14 = pMVar3->ps_uniforms_float4;
      piVar11 = pMVar3->ps_uniforms_int4;
      piVar6 = pMVar3->ps_uniforms_bool;
      MVar10 = MOJOSHADER_TYPE_PIXEL;
      GVar7 = 0x8804;
      uVar12 = 0;
    }
    if (MVar2 == MOJOSHADER_UNIFORM_BOOL) {
      if (ctx->have_GL_NV_gpu_program4 == 0) {
        if (0 < iVar13) {
          do {
            local_58 = 0.0;
            if (*piVar6 != 0) {
              local_58 = 1.0;
            }
            local_54 = local_58;
            local_50 = local_58;
            local_4c = local_58;
            (*ctx->glProgramLocalParameter4fvARB)(GVar7,(GLuint)uVar12,&local_58);
            piVar6 = piVar6 + 1;
            uVar12 = (ulong)((GLuint)uVar12 + 1);
            iVar13 = iVar13 + -1;
          } while (iVar13 != 0);
        }
      }
      else if (0 < iVar13) {
        do {
          local_58 = (float)(uint)(*piVar6 != 0);
          local_54 = local_58;
          local_50 = local_58;
          local_4c = local_58;
          (*ctx->glProgramLocalParameterI4ivNV)(GVar7,(GLuint)uVar12,(GLint *)&local_58);
          piVar6 = piVar6 + 1;
          uVar12 = (ulong)((GLuint)uVar12 + 1);
          iVar13 = iVar13 + -1;
        } while (iVar13 != 0);
      }
    }
    else if (MVar2 == MOJOSHADER_UNIFORM_INT) {
      if (ctx->have_GL_NV_gpu_program4 == 0) {
        if (0 < iVar13) {
          do {
            local_58 = (float)*piVar11;
            local_54 = (float)piVar11[1];
            local_50 = (float)piVar11[2];
            local_4c = (float)piVar11[3];
            (*ctx->glProgramLocalParameter4fvARB)(GVar7,(GLuint)uVar12,&local_58);
            piVar11 = piVar11 + 4;
            uVar12 = (ulong)((GLuint)uVar12 + 1);
            iVar13 = iVar13 + -1;
          } while (iVar13 != 0);
        }
      }
      else if (0 < iVar13) {
        do {
          (*ctx->glProgramLocalParameterI4ivNV)(GVar7,(GLuint)uVar12,piVar11);
          piVar11 = piVar11 + 4;
          uVar12 = (ulong)((GLuint)uVar12 + 1);
          iVar13 = iVar13 + -1;
        } while (iVar13 != 0);
      }
    }
    else if ((MVar2 == MOJOSHADER_UNIFORM_FLOAT) && (0 < iVar13)) {
      do {
        (*ctx->glProgramLocalParameter4fvARB)(GVar7,(GLuint)uVar12,pGVar14);
        pGVar14 = pGVar14 + 4;
        uVar12 = (ulong)((GLuint)uVar12 + 1);
        iVar13 = iVar13 + -1;
      } while (iVar13 != 0);
    }
    uVar8 = uVar8 + 1;
  } while (uVar8 != local_38);
  if ((pMVar3->texbem_count != 0) && (pMVar3->texbem_count != 0)) {
    pGVar14 = pMVar3->ps_uniforms_float4 +
              (pMVar3->ps_uniforms_float4_count * 4 - (ulong)(pMVar3->texbem_count << 3));
    uVar5 = 0;
    uVar8 = local_40;
    do {
      GVar15 = (GLuint)uVar8;
      (*ctx->glProgramLocalParameter4fvARB)(0x8804,GVar15,pGVar14);
      (*ctx->glProgramLocalParameter4fvARB)(0x8804,GVar15 + 1,pGVar14 + 4);
      uVar5 = uVar5 + 1;
      uVar8 = (ulong)(GVar15 + 2);
      pGVar14 = pGVar14 + 8;
    } while (uVar5 < pMVar3->texbem_count);
  }
  return;
}

Assistant:

static void impl_ARB1_PushUniforms(void)
{
    // vertex shader uniforms come first in program->uniforms array.
    MOJOSHADER_shaderType shader_type = MOJOSHADER_TYPE_VERTEX;
    GLenum arb_shader_type = arb1_shader_type(shader_type);
    const MOJOSHADER_glProgram *program = ctx->bound_program;
    const uint32 count = program->uniform_count;
    const GLfloat *srcf = program->vs_uniforms_float4;
    const GLint *srci = program->vs_uniforms_int4;
    const GLint *srcb = program->vs_uniforms_bool;
    GLint loc = 0;
    GLint texbem_loc = 0;
    uint32 i;

    assert(count > 0);  // shouldn't call this with nothing to do!

    for (i = 0; i < count; i++)
    {
        UniformMap *map = &program->uniforms[i];
        const MOJOSHADER_shaderType uniform_shader_type = map->shader_type;
        const MOJOSHADER_uniform *u = map->uniform;
        const MOJOSHADER_uniformType type = u->type;
        const int size = u->array_count ? u->array_count : 1;

        assert(!u->constant);

        // Did we switch from vertex to pixel (to geometry, etc)?
        if (shader_type != uniform_shader_type)
        {
            if (shader_type == MOJOSHADER_TYPE_PIXEL)
                texbem_loc = loc;

            // we start with vertex, move to pixel, then to geometry, etc.
            //  The array should always be sorted as such.
            if (uniform_shader_type == MOJOSHADER_TYPE_PIXEL)
            {
                assert(shader_type == MOJOSHADER_TYPE_VERTEX);
                srcf = program->ps_uniforms_float4;
                srci = program->ps_uniforms_int4;
                srcb = program->ps_uniforms_bool;
                loc = 0;
            } // if
            else
            {
                // These should be ordered vertex, then pixel, then geometry.
                assert(0 && "Unexpected shader type");
            } // else

            shader_type = uniform_shader_type;
            arb_shader_type = arb1_shader_type(uniform_shader_type);
        } // if

        if (type == MOJOSHADER_UNIFORM_FLOAT)
        {
            int i;
            for (i = 0; i < size; i++, srcf += 4, loc++)
                ctx->glProgramLocalParameter4fvARB(arb_shader_type, loc, srcf);
        } // if
        else if (type == MOJOSHADER_UNIFORM_INT)
        {
            int i;
            if (ctx->have_GL_NV_gpu_program4)
            {
                // GL_NV_gpu_program4 has integer uniform loading support.
                for (i = 0; i < size; i++, srci += 4, loc++)
                    ctx->glProgramLocalParameterI4ivNV(arb_shader_type, loc, srci);
            } // if
            else
            {
                for (i = 0; i < size; i++, srci += 4, loc++)
                {
                    const GLfloat fv[4] = {
                        (GLfloat) srci[0], (GLfloat) srci[1],
                        (GLfloat) srci[2], (GLfloat) srci[3]
                    };
                    ctx->glProgramLocalParameter4fvARB(arb_shader_type, loc, fv);
                } // for
            } // else
        } // else if
        else if (type == MOJOSHADER_UNIFORM_BOOL)
        {
            int i;
            if (ctx->have_GL_NV_gpu_program4)
            {
                // GL_NV_gpu_program4 has integer uniform loading support.
                for (i = 0; i < size; i++, srcb++, loc++)
                {
                    const GLint ib = (GLint) ((*srcb) ? 1 : 0);
                    const GLint iv[4] = { ib, ib, ib, ib };
                    ctx->glProgramLocalParameterI4ivNV(arb_shader_type, loc, iv);
                } // for
            } // if
            else
            {
                for (i = 0; i < size; i++, srcb++, loc++)
                {
                    const GLfloat fb = (GLfloat) ((*srcb) ? 1.0f : 0.0f);
                    const GLfloat fv[4] = { fb, fb, fb, fb };
                    ctx->glProgramLocalParameter4fvARB(arb_shader_type, loc, fv);
                } // for
            } // else
        } // else if
    } // for

    if (program->texbem_count)
    {
        const GLenum target = GL_FRAGMENT_PROGRAM_ARB;
        GLfloat *srcf = program->ps_uniforms_float4;
        srcf += (program->ps_uniforms_float4_count * 4) -
                (program->texbem_count * 8);
        loc = texbem_loc;
        for (i = 0; i < program->texbem_count; i++, srcf += 8)
        {
            ctx->glProgramLocalParameter4fvARB(target, loc++, srcf);
            ctx->glProgramLocalParameter4fvARB(target, loc++, srcf + 4);
        } // for
    } // if
}